

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O3

bool __thiscall BanMan::Unban(BanMan *this,CSubNet *sub_net)

{
  size_t sVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>,_std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>_>
  pVar3;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_owns = false;
  local_30._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_30);
  pVar3 = std::
          _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
          ::equal_range(&(this->m_banned)._M_t,sub_net);
  sVar1 = (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::_M_erase_aux(&(this->m_banned)._M_t,(_Base_ptr)pVar3.first._M_node,
                 (_Base_ptr)pVar3.second._M_node);
  sVar2 = (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == sVar2) {
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  else {
    this->m_is_dirty = true;
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    if (this->m_client_interface != (CClientUIInterface *)0x0) {
      CClientUIInterface::BannedListChanged(this->m_client_interface);
    }
    DumpBanlist(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return sVar1 != sVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BanMan::Unban(const CSubNet& sub_net)
{
    {
        LOCK(m_banned_mutex);
        if (m_banned.erase(sub_net) == 0) return false;
        m_is_dirty = true;
    }
    if (m_client_interface) m_client_interface->BannedListChanged();
    DumpBanlist(); //store banlist to disk immediately
    return true;
}